

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxx_message.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cxx::MessageGenerator::GenerateSwap
          (MessageGenerator *this,Printer *printer)

{
  uint uVar1;
  FieldGenerator *pFVar2;
  Descriptor *pDVar3;
  uint uVar4;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong uVar5;
  uint uVar6;
  char *text;
  long lVar7;
  long lVar8;
  string local_50;
  
  io::Printer::Print(printer,"void $classname$::Swap($classname$* other) {\n","classname",
                     &this->classname_);
  io::Printer::Indent(printer);
  io::Printer::Print(printer,"if (other != this) {\n");
  io::Printer::Indent(printer);
  if (*(int *)(*(long *)(*(long *)(this->descriptor_ + 0x10) + 0x88) + 0x50) == 2) {
    text = "GetReflection()->Swap(this, other);";
  }
  else {
    pDVar3 = this->descriptor_;
    uVar5 = extraout_RDX;
    if (0 < *(int *)(pDVar3 + 0x2c)) {
      lVar7 = 0;
      lVar8 = 0;
      do {
        pFVar2 = FieldGeneratorMap::get
                           (&this->field_generators_,
                            (FieldDescriptor *)(*(long *)(pDVar3 + 0x30) + lVar7));
        (*pFVar2->_vptr_FieldGenerator[8])(pFVar2,printer);
        lVar8 = lVar8 + 1;
        pDVar3 = this->descriptor_;
        lVar7 = lVar7 + 0x78;
        uVar5 = extraout_RDX_00;
      } while (lVar8 < *(int *)(pDVar3 + 0x2c));
    }
    pDVar3 = this->descriptor_;
    if (0 < *(int *)(pDVar3 + 0x2c)) {
      uVar6 = 0;
      do {
        SimpleItoa_abi_cxx11_(&local_50,(protobuf *)(ulong)uVar6,(int)uVar5);
        io::Printer::Print(printer,"std::swap(_has_bits_[$i$], other->_has_bits_[$i$]);\n","i",
                           &local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        uVar6 = uVar6 + 1;
        pDVar3 = this->descriptor_;
        uVar1 = *(int *)(pDVar3 + 0x2c) + 0x1f;
        uVar5 = (ulong)uVar1;
        uVar4 = *(int *)(pDVar3 + 0x2c) + 0x3e;
        if (-1 < (int)uVar1) {
          uVar4 = uVar1;
        }
      } while ((int)uVar6 < (int)uVar4 >> 5);
    }
    if (*(int *)(*(long *)(*(long *)(pDVar3 + 0x10) + 0x88) + 0x50) != 3) {
      io::Printer::Print(printer,"_unknown_fields_.Swap(&other->_unknown_fields_);\n");
    }
    io::Printer::Print(printer,"std::swap(_cached_size_, other->_cached_size_);\n");
    if (*(int *)(this->descriptor_ + 0x58) < 1) goto LAB_001c2f08;
    text = "_extensions_.Swap(&other->_extensions_);\n";
  }
  io::Printer::Print(printer,text);
LAB_001c2f08:
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"}\n");
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"}\n");
  return;
}

Assistant:

void MessageGenerator::
GenerateSwap(io::Printer* printer) {
  // Generate the Swap member function.
  printer->Print("void $classname$::Swap($classname$* other) {\n",
                 "classname", classname_);
  printer->Indent();
  printer->Print("if (other != this) {\n");
  printer->Indent();

  if (HasGeneratedMethods(descriptor_->file())) {
    for (int i = 0; i < descriptor_->field_count(); i++) {
      const FieldDescriptor* field = descriptor_->field(i);
      field_generators_.get(field).GenerateSwappingCode(printer);
    }

    for (int i = 0; i < (descriptor_->field_count() + 31) / 32; ++i) {
      printer->Print("std::swap(_has_bits_[$i$], other->_has_bits_[$i$]);\n",
                     "i", SimpleItoa(i));
    }

    if (HasUnknownFields(descriptor_->file())) {
      printer->Print("_unknown_fields_.Swap(&other->_unknown_fields_);\n");
    }
    printer->Print("std::swap(_cached_size_, other->_cached_size_);\n");
    if (descriptor_->extension_range_count() > 0) {
      printer->Print("_extensions_.Swap(&other->_extensions_);\n");
    }
  } else {
    printer->Print("GetReflection()->Swap(this, other);");
  }

  printer->Outdent();
  printer->Print("}\n");
  printer->Outdent();
  printer->Print("}\n");
}